

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<unsigned_int&,spv::StorageClass>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1)

{
  Vector<spirv_cross::SPIRVariable_*> *this_00;
  uint uVar1;
  StorageClass SVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var3;
  ulong count;
  size_t sVar4;
  SPIRVariable *pSVar5;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var6;
  
  this_00 = &this->vacants;
  sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
  if (sVar4 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(count * 0xb0);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl ==
        (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
      _Var6._M_head_impl =
           (SPIRVariable *)
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,sVar4 + 1);
        sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4] =
             _Var6._M_head_impl;
        sVar4 = sVar4 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar4;
        _Var6._M_head_impl = _Var6._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size + 1);
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .ptr[sVar4]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
         _Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .buffer_size = sVar4 + 1;
    sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4 - 1];
    if (sVar4 == 0) goto LAB_0025951c;
  }
  else {
    pSVar5 = (this_00->super_VectorView<spirv_cross::SPIRVariable_*>).ptr[sVar4 - 1];
  }
  SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(this_00,sVar4 - 1);
LAB_0025951c:
  uVar1 = *p;
  SVar2 = *p_1;
  (pSVar5->super_IVariant).self.id = 0;
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_004fb008;
  *(uint *)&(pSVar5->super_IVariant).field_0xc = uVar1;
  pSVar5->storage = SVar2;
  pSVar5->decoration = 0;
  pSVar5->initializer = 0;
  (pSVar5->basevariable).id = 0;
  (pSVar5->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar5->dereference_chain).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar5->dereference_chain).stack_storage;
  (pSVar5->dereference_chain).buffer_capacity = 8;
  pSVar5->compat_builtin = false;
  pSVar5->statically_assigned = false;
  (pSVar5->static_expression).id = 0;
  (pSVar5->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0
  ;
  (pSVar5->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(pSVar5->dependees).stack_storage;
  (pSVar5->dependees).buffer_capacity = 8;
  pSVar5->parameter = (Parameter *)0x0;
  pSVar5->deferred_declaration = false;
  pSVar5->phi_variable = false;
  pSVar5->allocate_temporary_copy = false;
  pSVar5->remapped_variable = false;
  pSVar5->remapped_components = 0;
  *(undefined8 *)((long)&pSVar5->remapped_components + 3) = 0;
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}